

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O3

void __thiscall
vkt::DynamicState::anon_unknown_0::DepthStencilBaseCase::setDynamicViewportState
          (DepthStencilBaseCase *this,deUint32 width,deUint32 height)

{
  (*this->m_vk->_vptr_DeviceInterface[0x4d])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1
            );
  (*this->m_vk->_vptr_DeviceInterface[0x4e])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1
            );
  return;
}

Assistant:

void setDynamicViewportState (const deUint32 width, const deUint32 height)
	{
		vk::VkViewport viewport;
		viewport.x = 0;
		viewport.y = 0;
		viewport.width = static_cast<float>(width);
		viewport.height = static_cast<float>(height);
		viewport.minDepth = 0.0f;
		viewport.maxDepth = 1.0f;

		m_vk.cmdSetViewport(*m_cmdBuffer, 0, 1, &viewport);

		vk::VkRect2D scissor;
		scissor.offset.x = 0;
		scissor.offset.y = 0;
		scissor.extent.width = width;
		scissor.extent.height = height;
		m_vk.cmdSetScissor(*m_cmdBuffer, 0, 1, &scissor);
	}